

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::processM2TSPCR(TSMuxer *this,int64_t pcrVal,int64_t pcrGAP)

{
  int iVar1;
  pointer ppVar2;
  uchar *puVar3;
  MuxerManager *this_00;
  uint8_t *puVar4;
  int iVar5;
  longlong lVar6;
  long lVar7;
  long lVar8;
  iterator __begin2;
  pointer ppVar9;
  uint8_t *buffer;
  double dVar10;
  double local_48;
  
  iVar5 = calcM2tsFrameCnt(this);
  lVar7 = pcrVal * 300 - pcrGAP;
  dVar10 = (double)(lVar7 - this->m_prevM2TSPCR) / (double)iVar5;
  local_48 = (double)this->m_prevM2TSPCR;
  ppVar9 = (this->m_m2tsDelayBlocks).
           super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->m_m2tsDelayBlocks).
           super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar5 = this->m_prevM2TSPCROffset;
  if (ppVar9 != ppVar2) {
    for (; ppVar9 != ppVar2; ppVar9 = ppVar9 + 1) {
      puVar3 = ppVar9->first;
      lVar8 = (long)iVar5;
      while( true ) {
        iVar5 = ppVar9->second;
        if (iVar5 <= (int)lVar8) break;
        local_48 = local_48 + dVar10;
        lVar6 = llround(local_48);
        writeM2TSHeader(puVar3 + lVar8,lVar6);
        lVar8 = lVar8 + 0xc0;
      }
      this_00 = (this->super_AbstractMuxer).m_owner;
      if (this_00->m_asyncMode == true) {
        MuxerManager::asyncWriteBuffer
                  (this_00,&this->super_AbstractMuxer,ppVar9->first,iVar5,this->m_muxFile);
      }
      else {
        MuxerManager::syncWriteBuffer
                  (this_00,&this->super_AbstractMuxer,ppVar9->first,iVar5,this->m_muxFile);
        if (ppVar9->first != (uchar *)0x0) {
          operator_delete__(ppVar9->first);
        }
      }
      iVar5 = (int)lVar8 - ppVar9->second;
    }
    this->m_prevM2TSPCROffset = iVar5;
    ppVar9 = (this->m_m2tsDelayBlocks).
             super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_m2tsDelayBlocks).
        super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar9) {
      (this->m_m2tsDelayBlocks).
      super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar9;
    }
  }
  puVar4 = this->m_outBuf;
  iVar1 = this->m_outBufLen;
  lVar8 = (long)iVar1 - (long)iVar5;
  for (buffer = puVar4 + iVar5; buffer < puVar4 + iVar1; buffer = buffer + 0xc0) {
    local_48 = local_48 + dVar10;
    lVar6 = llround(local_48);
    writeM2TSHeader(buffer,lVar6);
    lVar8 = lVar8 + -0xc0;
  }
  if (lVar8 == 0) {
    this->m_prevM2TSPCROffset = this->m_outBufLen;
    this->m_prevM2TSPCR = lVar7;
    return;
  }
  __assert_fail("curPos == end",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                ,0x21e,"void TSMuxer::processM2TSPCR(const int64_t, const int64_t)");
}

Assistant:

void TSMuxer::processM2TSPCR(const int64_t pcrVal, const int64_t pcrGAP)
{
    const int m2tsFrameCnt = calcM2tsFrameCnt();
    const int64_t hiResPCR = pcrVal * 300 - pcrGAP;
    const int64_t pcrValDif = hiResPCR - m_prevM2TSPCR;  // m2ts pcr clock based on full 27Mhz counter
    const double pcrIncPerFrame = static_cast<double>(pcrValDif) / m2tsFrameCnt;

    auto curM2TSPCR = static_cast<double>(m_prevM2TSPCR);
    uint8_t* curPos;
    if (!m_m2tsDelayBlocks.empty())
    {
        int offset = m_prevM2TSPCROffset;
        for (const auto& i : m_m2tsDelayBlocks)
        {
            curPos = i.first + offset;
            int j = offset;
            for (; j < i.second; j += 192)
            {
                curM2TSPCR += pcrIncPerFrame;
                writeM2TSHeader(curPos, llround(curM2TSPCR));
                curPos += 192;
            }
            if (m_owner->isAsyncMode())
                m_owner->asyncWriteBuffer(this, i.first, i.second, m_muxFile);
            else
            {
                m_owner->syncWriteBuffer(this, i.first, i.second, m_muxFile);
                delete[] i.first;
            }
            offset = j - i.second;
        }
        m_prevM2TSPCROffset = offset;
        m_m2tsDelayBlocks.clear();
    }
    curPos = m_outBuf + m_prevM2TSPCROffset;
    const uint8_t* end = m_outBuf + m_outBufLen;
    for (; curPos < end; curPos += 192)
    {
        curM2TSPCR += pcrIncPerFrame;
        writeM2TSHeader(curPos, llround(curM2TSPCR));
    }
    assert(curPos == end);
    m_prevM2TSPCROffset = m_outBufLen;
    // assert((int64_t) curM2TSPCR == hiResPCR);
    m_prevM2TSPCR = hiResPCR;
}